

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSX.cpp
# Opt level: O0

string * __thiscall
MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,true>::debug_type_abi_cxx11_
          (string *__return_storage_ptr__,
          ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,true> *this)

{
  bool bVar1;
  HandledSlot *pHVar2;
  pointer pMVar3;
  allocator<char> local_45 [13];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,true> *local_18;
  ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,_true> *this_local;
  
  local_18 = this;
  this_local = (ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,_true> *)
               __return_storage_ptr__;
  pHVar2 = ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,_true>::cartridge_primary
                     ((ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,_true> *)this);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&pHVar2->handler);
  if (bVar1) {
    pHVar2 = ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,_true>::cartridge_primary
                       ((ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,_true> *)this);
    pMVar3 = std::unique_ptr<MSX::MemorySlotHandler,_std::default_delete<MSX::MemorySlotHandler>_>::
             operator->(&pHVar2->handler);
    (*pMVar3->_vptr_MemorySlotHandler[5])();
    std::operator+(__return_storage_ptr__,"MSX:",&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"MSX",local_45);
    std::allocator<char>::~allocator(local_45);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string debug_type() final {
			if(cartridge_primary().handler) {
				return "MSX:" + cartridge_primary().handler->debug_type();
			}
			return "MSX";
		}